

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  int n;
  fmt_helper *this_00;
  memory_buf_t *dest_00;
  string_view_t view;
  char local_77 [15];
  undefined1 local_68 [8];
  scoped_padder p;
  size_t field_size;
  memory_buf_t *dest_local;
  tm *tm_time_local;
  log_msg *param_1_local;
  r_formatter<spdlog::details::scoped_padder> *this_local;
  
  p.spaces_.size_ = 0xb;
  scoped_padder::scoped_padder
            ((scoped_padder *)local_68,0xb,&(this->super_flag_formatter).padinfo_,dest);
  n = details::to12h(tm_time);
  fmt_helper::pad2(n,dest);
  local_77[2] = 0x3a;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_77 + 2);
  fmt_helper::pad2(tm_time->tm_min,dest);
  local_77[1] = 0x3a;
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_77 + 1);
  fmt_helper::pad2(tm_time->tm_sec,dest);
  local_77[0] = ' ';
  fmt::v10::detail::buffer<char>::push_back(&dest->super_buffer<char>,local_77);
  this_00 = (fmt_helper *)details::ampm(tm_time);
  dest_00 = (memory_buf_t *)std::char_traits<char>::length((char_type *)this_00);
  view.size_ = (size_t)dest;
  view.data_ = (char *)dest_00;
  fmt_helper::append_string_view(this_00,view,dest_00);
  scoped_padder::~scoped_padder((scoped_padder *)local_68);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }